

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

object * findProc(void)

{
  object *poVar1;
  object *poVar2;
  int iVar3;
  object *poVar4;
  object *poVar5;
  object *poVar6;
  bool bVar7;
  
  poVar6 = topScope;
  stringCopy(idName,guard->name);
  poVar2 = universe;
  poVar1 = guard;
  poVar4 = (object *)0x0;
  for (bVar7 = false; poVar5 = poVar6, !bVar7; bVar7 = bVar7 || poVar4 != poVar1) {
    do {
      poVar4 = poVar5->next;
      iVar3 = stringCompare(poVar4->name,idName);
      poVar5 = poVar4;
    } while (iVar3 != 0);
    bVar7 = poVar6 == poVar2;
    poVar6 = poVar6->dsc;
  }
  return poVar4;
}

Assistant:

object *findProc(void) {
	variable int ret; variable bool cond;
	variable struct object *s; variable struct object *obj; variable struct object *x;
	s = NULL; obj = NULL; x = NULL; cond = true;
	s = topScope;
	stringCopy(idName,guard->name);
	while (cond == true) {
		x=s->next;
		ret = stringCompare(x->name,idName);	
		while (ret != 0) {
			x = x->next;
			ret = stringCompare(x->name,idName);
		}
		if ((x != guard) || (s == universe)) {
			cond = false;
		}
		obj = x;
		s = s->dsc;
	}
	return obj;
}